

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_filename.c
# Opt level: O0

wchar_t archive_read_open_filename_w(archive_conflict *a,wchar_t *wfilename,size_t block_size)

{
  wchar_t wVar1;
  int iVar2;
  size_t sVar3;
  undefined4 *__ptr;
  int *piVar4;
  uint *puVar5;
  wchar_t *in_RDX;
  archive *in_RSI;
  archive *in_RDI;
  archive_string fn;
  read_file_data *mine;
  void *in_stack_ffffffffffffffa8;
  archive *in_stack_ffffffffffffffb0;
  archive *in_stack_ffffffffffffffb8;
  archive *in_stack_ffffffffffffffc8;
  archive *as;
  wchar_t local_4;
  
  sVar3 = wcslen((wchar_t *)in_RSI);
  __ptr = (undefined4 *)calloc(1,sVar3 * 4 + 0x28);
  if (__ptr == (undefined4 *)0x0) {
    archive_set_error(in_RDI,0xc,"No memory");
    local_4 = L'\xffffffe2';
  }
  else {
    *__ptr = 0xffffffff;
    *(wchar_t **)(__ptr + 2) = in_RDX;
    if ((in_RSI == (archive *)0x0) || (in_RSI->magic == 0)) {
      __ptr[8] = 0;
      in_RSI = in_stack_ffffffffffffffb8;
    }
    else {
      in_stack_ffffffffffffffc8 = (archive *)0x0;
      as = in_RSI;
      wcslen((wchar_t *)in_RSI);
      wVar1 = archive_string_append_from_wcs((archive_string *)as,in_RDX,(size_t)__ptr);
      if (wVar1 != L'\0') {
        piVar4 = __errno_location();
        if (*piVar4 == 0xc) {
          puVar5 = (uint *)__errno_location();
          archive_set_error(in_RDI,(int)(ulong)*puVar5,"Can\'t allocate memory");
        }
        else {
          archive_set_error(in_RDI,0x16,
                            "Failed to convert a wide-character filename to a multi-byte filename");
        }
        archive_string_free((archive_string *)0x12f83a);
        free(__ptr);
        return L'\xffffffe2';
      }
      __ptr[8] = 1;
      strcpy((char *)(__ptr + 9),(char *)0x0);
      archive_string_free((archive_string *)0x12f87a);
    }
    iVar2 = archive_read_append_callback_data(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (iVar2 == 0) {
      archive_read_set_open_callback(in_RSI,(undefined1 *)in_stack_ffffffffffffffb0);
      archive_read_set_read_callback(in_RSI,(archive_read_callback *)in_stack_ffffffffffffffb0);
      archive_read_set_skip_callback(in_RSI,(archive_skip_callback *)in_stack_ffffffffffffffb0);
      archive_read_set_close_callback(in_RSI,(undefined1 *)in_stack_ffffffffffffffb0);
      archive_read_set_switch_callback(in_RSI,(archive_switch_callback *)in_stack_ffffffffffffffb0);
      archive_read_set_seek_callback(in_RSI,(archive_seek_callback *)in_stack_ffffffffffffffb0);
      local_4 = archive_read_open1(in_stack_ffffffffffffffc8);
    }
    else {
      local_4 = L'\xffffffe2';
    }
  }
  return local_4;
}

Assistant:

int
archive_read_open_filename_w(struct archive *a, const wchar_t *wfilename,
    size_t block_size)
{
	struct read_file_data *mine = (struct read_file_data *)calloc(1,
		sizeof(*mine) + wcslen(wfilename) * sizeof(wchar_t));
	if (!mine)
	{
		archive_set_error(a, ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	mine->fd = -1;
	mine->block_size = block_size;

	if (wfilename == NULL || wfilename[0] == L'\0') {
		mine->filename_type = FNT_STDIN;
	} else {
#if defined(_WIN32) && !defined(__CYGWIN__)
		mine->filename_type = FNT_WCS;
		wcscpy(mine->filename.w, wfilename);
#else
		/*
		 * POSIX system does not support a wchar_t interface for
		 * open() system call, so we have to translate a whcar_t
		 * filename to multi-byte one and use it.
		 */
		struct archive_string fn;

		archive_string_init(&fn);
		if (archive_string_append_from_wcs(&fn, wfilename,
		    wcslen(wfilename)) != 0) {
			if (errno == ENOMEM)
				archive_set_error(a, errno,
				    "Can't allocate memory");
			else
				archive_set_error(a, EINVAL,
				    "Failed to convert a wide-character"
				    " filename to a multi-byte filename");
			archive_string_free(&fn);
			free(mine);
			return (ARCHIVE_FATAL);
		}
		mine->filename_type = FNT_MBS;
		strcpy(mine->filename.m, fn.s);
		archive_string_free(&fn);
#endif
	}
	if (archive_read_append_callback_data(a, mine) != (ARCHIVE_OK))
		return (ARCHIVE_FATAL);
	archive_read_set_open_callback(a, file_open);
	archive_read_set_read_callback(a, file_read);
	archive_read_set_skip_callback(a, file_skip);
	archive_read_set_close_callback(a, file_close);
	archive_read_set_switch_callback(a, file_switch);
	archive_read_set_seek_callback(a, file_seek);

	return (archive_read_open1(a));
}